

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall LiteScript::ClassObject::AddMember(ClassObject *this,char *name,Variable *v)

{
  Variable local_98 [2];
  allocator local_71;
  string local_70 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_50;
  Variable *local_20;
  Variable *v_local;
  char *name_local;
  ClassObject *this_local;
  
  local_20 = v;
  v_local = (Variable *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,name,&local_71);
  Variable::Variable(local_98,local_20);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
             ,local_98);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::push_back(&this->members,&local_50);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::~pair(&local_50);
  Variable::~Variable(local_98);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void LiteScript::ClassObject::AddMember(const char *name, const Variable &v) {
    this->members.push_back({ std::string(name), Variable(v) });
}